

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectgenerator.cpp
# Opt level: O1

QString * __thiscall
ProjectGenerator::getWritableVar
          (QString *__return_storage_ptr__,ProjectGenerator *this,char *vk,bool param_2)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  QList<ProString> *this_00;
  iterator this_01;
  iterator iVar9;
  ulong uVar10;
  ProString *pPVar11;
  long in_FS_OFFSET;
  QByteArrayView QVar12;
  ProKey v;
  QStringBuilder<const_char_(&)[4],_QString_&> local_128;
  ProString local_118;
  QStringBuilder<ProString,_const_char_(&)[5]> local_e8;
  QString local_a8;
  undefined1 local_88 [32];
  undefined1 local_68 [28];
  int iStack_4c;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffffb0 = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  ProKey::ProKey((ProKey *)local_68,vk);
  this_00 = &QMakeEvaluator::valuesRef
                       (&((this->super_MakefileGenerator).project)->super_QMakeEvaluator,
                        (ProKey *)local_68)->super_QList<ProString>;
  if ((this_00->d).size == 0) {
    QVar12.m_data = (storage_type *)0x0;
    QVar12.m_size = (qsizetype)&local_e8;
    QString::fromUtf8(QVar12);
    qVar3 = local_e8.a.m_string.d.size;
    pcVar2 = local_e8.a.m_string.d.ptr;
    pDVar1 = local_e8.a.m_string.d.d;
    local_e8.a.m_string.d.d = (Data *)0x0;
    local_e8.a.m_string.d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = pcVar2;
    local_e8.a.m_string.d.size = 0;
    (__return_storage_ptr__->d).size = qVar3;
    goto LAB_001a512b;
  }
  this_01 = QList<ProString>::begin(this_00);
  iVar9 = QList<ProString>::end(this_00);
  if (this_01.i != iVar9.i) {
    do {
      iVar8 = ProString::indexOf(this_01.i,(QChar)0x20,0,CaseSensitive);
      if ((-1 < iVar8) &&
         (bVar7 = ProString::startsWith(this_01.i,(QChar)0x20,CaseSensitive), !bVar7)) {
        local_e8.a.m_string.d.d = (Data *)0x2b1745;
        local_e8.a.m_string.d.size = 0x2b1745;
        local_e8.a.m_string.d.ptr = (char16_t *)this_01.i;
        ProString::operator=
                  (this_01.i,
                   (QStringBuilder<QStringBuilder<const_char_(&)[2],_ProString_&>,_const_char_(&)[2]>
                    *)&local_e8);
      }
      this_01.i = this_01.i + 1;
      iVar9 = QList<ProString>::end(this_00);
    } while (this_01.i != iVar9.i);
  }
  local_88._0_8_ = (ProString *)0x0;
  local_88._8_8_ = (ProString *)0x0;
  local_88._16_8_ = (char *)0x0;
  bVar7 = ProString::endsWith((ProString *)local_68,"_REMOVE",CaseSensitive);
  if (bVar7) {
    ProString::mid(&local_118,(ProString *)local_68,0,iStack_4c + -7);
    ProString::ProString(&local_e8.a,&local_118);
    local_e8.b = (char (*) [5])0x2aa0f8;
    QStringBuilder<ProString,_const_char_(&)[5]>::convertTo<QString>(&local_a8,&local_e8);
LAB_001a4ea0:
    uVar6 = local_88._8_8_;
    uVar5 = local_88._0_8_;
    qVar3 = local_a8.d.size;
    pDVar1 = local_a8.d.d;
    local_a8.d.d = (Data *)local_88._0_8_;
    local_88._0_8_ = pDVar1;
    local_88._8_8_ = local_a8.d.ptr;
    local_a8.d.ptr = (char16_t *)uVar6;
    local_a8.d.size = local_88._16_8_;
    local_88._16_8_ = qVar3;
    if ((ProString *)uVar5 != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)uVar5)->d).d = *(int *)&(((QString *)uVar5)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)uVar5)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
      }
    }
    if ((ProString *)local_e8.a.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_e8.a.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_e8.a.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_e8.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_e8.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((ProString *)local_118.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_118.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_118.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      pPVar11 = (ProString *)local_118.m_string.d.d;
      if (*(int *)&(((QString *)&(local_118.m_string.d.d)->super_QArrayData)->d).d == 0) {
LAB_001a4f89:
        QArrayData::deallocate((QArrayData *)pPVar11,2,0x10);
      }
    }
  }
  else {
    bVar7 = ProString::endsWith((ProString *)local_68,"_ASSIGN",CaseSensitive);
    if (bVar7) {
      ProString::mid(&local_118,(ProString *)local_68,0,iStack_4c + -7);
      ProString::ProString(&local_e8.a,&local_118);
      local_e8.b = (char (*) [5])0x2aa8c2;
      QStringBuilder<ProString,_const_char_(&)[4]>::convertTo<QString>
                (&local_a8,(QStringBuilder<ProString,_const_char_(&)[4]> *)&local_e8);
      goto LAB_001a4ea0;
    }
    local_118.m_string.d.ptr = L" += ";
    local_118.m_string.d.d = (Data *)local_68;
    QStringBuilder<const_ProKey_&,_const_char_(&)[5]>::convertTo<QString>
              ((QString *)&local_e8,(QStringBuilder<const_ProKey_&,_const_char_(&)[5]> *)&local_118)
    ;
    uVar5 = local_88._8_8_;
    pPVar11 = (ProString *)local_88._0_8_;
    qVar3 = local_e8.a.m_string.d.size;
    pDVar1 = local_e8.a.m_string.d.d;
    local_e8.a.m_string.d.d = (Data *)local_88._0_8_;
    local_88._0_8_ = pDVar1;
    local_88._8_8_ = local_e8.a.m_string.d.ptr;
    local_e8.a.m_string.d.ptr = (char16_t *)uVar5;
    local_e8.a.m_string.d.size = local_88._16_8_;
    local_88._16_8_ = qVar3;
    if (pPVar11 != (ProString *)0x0) {
      LOCK();
      *(int *)&(pPVar11->m_string).d.d = *(int *)&(pPVar11->m_string).d.d + -1;
      UNLOCK();
      if (*(int *)&(pPVar11->m_string).d.d != 0) goto LAB_001a4f98;
      goto LAB_001a4f89;
    }
  }
LAB_001a4f98:
  local_e8.a.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.a.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.a.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  ProStringList::join((QString *)&local_e8,(ProStringList *)this_00,(QChar)0x20);
  if ((char *)0x50 < (char *)(local_e8.a.m_string.d.size + local_88._16_8_)) {
    local_118.m_string.d.d = (Data *)0x0;
    local_118.m_string.d.ptr = (char16_t *)0x0;
    local_118.m_string.d.size = 0;
    if ((char *)local_88._16_8_ != (char *)0x0) {
      uVar10 = 0;
      do {
        QString::append(&local_118," ",1);
        uVar10 = uVar10 + 1;
      } while (uVar10 < (ulong)local_88._16_8_);
    }
    local_128.a = (char (*) [4])0x2aa0fd;
    local_128.b = &local_118.m_string;
    ProStringList::join<char_const(&)[4],QString&>(&local_a8,(ProStringList *)this_00,&local_128);
    qVar3 = local_a8.d.size;
    pDVar4 = local_a8.d.d;
    pcVar2 = local_e8.a.m_string.d.ptr;
    pDVar1 = local_e8.a.m_string.d.d;
    local_a8.d.d = local_e8.a.m_string.d.d;
    local_e8.a.m_string.d.d = pDVar4;
    local_e8.a.m_string.d.ptr = local_a8.d.ptr;
    local_a8.d.ptr = pcVar2;
    local_a8.d.size = local_e8.a.m_string.d.size;
    local_e8.a.m_string.d.size = qVar3;
    if ((ProString *)pDVar1 != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&pDVar1->super_QArrayData)->d).d =
           *(int *)&(((QString *)&pDVar1->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&pDVar1->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&pDVar1->super_QArrayData,2,0x10);
      }
    }
    if (&(local_118.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_118.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  local_118.m_string.d.d = (Data *)local_88;
  local_118.m_string.d.size = 0x2ab0d8;
  local_118.m_string.d.ptr = (char16_t *)&local_e8;
  QStringBuilder<QStringBuilder<QString_&,_QString_&>,_const_char_(&)[2]>::convertTo<QString>
            (__return_storage_ptr__,
             (QStringBuilder<QStringBuilder<QString_&,_QString_&>,_const_char_(&)[2]> *)&local_118);
  if ((ProString *)local_e8.a.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_e8.a.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_e8.a.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_e8.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_e8.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)local_88._0_8_)->d).d = *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
    }
  }
LAB_001a512b:
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString
ProjectGenerator::getWritableVar(const char *vk, bool)
{
    const ProKey v(vk);
    ProStringList &vals = project->values(v);
    if(vals.isEmpty())
        return "";

    // If values contain spaces, ensure that they are quoted
    for (ProStringList::iterator it = vals.begin(); it != vals.end(); ++it) {
        if ((*it).contains(' ') && !(*it).startsWith(' '))
            *it = "\"" + *it + "\"";
    }

    QString ret;
    if(v.endsWith("_REMOVE"))
        ret = v.left(v.length() - 7) + " -= ";
    else if(v.endsWith("_ASSIGN"))
        ret = v.left(v.length() - 7) + " = ";
    else
        ret = v + " += ";
    QString join = vals.join(' ');
    if(ret.size() + join.size() > 80) {
        QString spaces;
        for(int i = 0; i < ret.size(); i++)
            spaces += " ";
        join = vals.join(" \\\n" + spaces);
    }
    return ret + join + "\n";
}